

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void highbd_generate_hog(uint8_t *src8,int stride,int rows,int cols,float *hist)

{
  int iVar1;
  int dy_00;
  int iVar2;
  ushort *puVar3;
  ushort *puVar4;
  ushort *puVar5;
  ushort *puVar6;
  int in_ECX;
  int iVar7;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float *in_R8;
  int idx;
  int temp;
  int dy;
  int dx;
  uint16_t *right;
  uint16_t *left;
  uint16_t *below;
  uint16_t *above;
  int c;
  int r;
  uint16_t *src;
  float total;
  int local_38;
  int local_34;
  long local_30;
  float local_24;
  
  local_24 = 0.1;
  local_30 = in_RDI * 2 + (long)in_ESI * 2;
  for (local_34 = 1; local_34 < in_EDX + -1; local_34 = local_34 + 1) {
    for (local_38 = 1; local_38 < in_ECX + -1; local_38 = local_38 + 1) {
      puVar3 = (ushort *)(local_30 + (long)(local_38 - in_ESI) * 2);
      puVar4 = (ushort *)(local_30 + (long)(local_38 + in_ESI) * 2);
      puVar5 = (ushort *)(local_30 + (long)(local_38 + -1) * 2);
      puVar6 = (ushort *)(local_30 + (long)(local_38 + 1) * 2);
      iVar1 = ((uint)puVar6[-in_ESI] + (uint)*puVar6 * 2 + (uint)puVar6[in_ESI]) -
              ((uint)puVar5[-in_ESI] + (uint)*puVar5 * 2 + (uint)puVar5[in_ESI]);
      dy_00 = ((uint)puVar4[-1] + (uint)*puVar4 * 2 + (uint)puVar4[1]) -
              ((uint)puVar3[-1] + (uint)*puVar3 * 2 + (uint)puVar3[1]);
      if ((iVar1 != 0) || (dy_00 != 0)) {
        iVar2 = iVar1;
        if (iVar1 < 1) {
          iVar2 = -iVar1;
        }
        iVar7 = dy_00;
        if (dy_00 < 1) {
          iVar7 = -dy_00;
        }
        iVar2 = iVar2 + iVar7;
        if (iVar2 != 0) {
          local_24 = (float)iVar2 + local_24;
          if (iVar1 == 0) {
            *in_R8 = (float)(iVar2 / 2) + *in_R8;
            in_R8[0x1f] = (float)(iVar2 / 2) + in_R8[0x1f];
          }
          else {
            iVar1 = get_hist_bin_idx(iVar1,dy_00);
            in_R8[iVar1] = (float)iVar2 + in_R8[iVar1];
          }
        }
      }
    }
    local_30 = local_30 + (long)in_ESI * 2;
  }
  normalize_hog(local_24,in_R8);
  return;
}

Assistant:

static inline void highbd_generate_hog(const uint8_t *src8, int stride,
                                       int rows, int cols, float *hist) {
  float total = 0.1f;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  src += stride;
  for (int r = 1; r < rows - 1; ++r) {
    for (int c = 1; c < cols - 1; ++c) {
      const uint16_t *above = &src[c - stride];
      const uint16_t *below = &src[c + stride];
      const uint16_t *left = &src[c - 1];
      const uint16_t *right = &src[c + 1];
      // Calculate gradient using Sobel filters.
      const int dx = (right[-stride] + 2 * right[0] + right[stride]) -
                     (left[-stride] + 2 * left[0] + left[stride]);
      const int dy = (below[-1] + 2 * below[0] + below[1]) -
                     (above[-1] + 2 * above[0] + above[1]);
      if (dx == 0 && dy == 0) continue;
      const int temp = abs(dx) + abs(dy);
      if (!temp) continue;
      total += temp;
      if (dx == 0) {
        hist[0] += temp / 2;
        hist[BINS - 1] += temp / 2;
      } else {
        const int idx = get_hist_bin_idx(dx, dy);
        assert(idx >= 0 && idx < BINS);
        hist[idx] += temp;
      }
    }
    src += stride;
  }

  normalize_hog(total, hist);
}